

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  undefined8 this_00;
  bool bVar1;
  int iVar2;
  FieldDescriptorProto_Type FVar3;
  string *psVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  MessageOptions *this_01;
  FieldDescriptorProto *this_02;
  ulong uVar7;
  FieldDescriptorProto *this_03;
  FieldOptions *pFVar8;
  UninterpretedOption *this_04;
  UninterpretedOption_NamePart *pUVar9;
  UninterpretedOption *pUVar10;
  undefined1 auVar11 [16];
  string_view field_name;
  UninterpretedOption *option;
  int i;
  FieldDescriptorProto *value_field;
  FieldDescriptorProto *key_field;
  undefined1 local_e0 [8];
  string entry_name;
  DescriptorProto *entry;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  FieldDescriptorProto *field_local;
  MapField *map_field_local;
  Parser *this_local;
  
  entry_name.field_2._8_8_ = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(messages);
  psVar4 = FieldDescriptorProto::name_abi_cxx11_(field);
  auVar11 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
  field_name._M_len = auVar11._8_8_;
  field_name._M_str = (char *)messages;
  compiler::(anonymous_namespace)::MapEntryName_abi_cxx11_
            ((string *)local_e0,auVar11._0_8_,field_name);
  puVar5 = protobuf::internal::HasBits<1>::operator[](&(field->field_0)._impl_._has_bits_,0);
  *(byte *)puVar5 = (byte)*puVar5 | 4;
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)field);
  protobuf::internal::ArenaStringPtr::Set<>
            (&(field->field_0)._impl_.type_name_,(string *)local_e0,pAVar6);
  this_00 = entry_name.field_2._8_8_;
  puVar5 = protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)(entry_name.field_2._8_8_ + 0x10),0);
  *(byte *)puVar5 = (byte)*puVar5 | 1;
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  protobuf::internal::ArenaStringPtr::Set<>
            ((ArenaStringPtr *)(this_00 + 0xd8),(string *)local_e0,pAVar6);
  this_01 = DescriptorProto::mutable_options((DescriptorProto *)entry_name.field_2._8_8_);
  MessageOptions::set_map_entry(this_01,true);
  this_02 = DescriptorProto::add_field((DescriptorProto *)entry_name.field_2._8_8_);
  puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
  *(byte *)puVar5 = (byte)*puVar5 | 1;
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
  protobuf::internal::ArenaStringPtr::Set(&(this_02->field_0)._impl_.name_,"key",pAVar6);
  FieldDescriptorProto::set_label(this_02,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  FieldDescriptorProto::set_number(this_02,1);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 4;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
    protobuf::internal::ArenaStringPtr::Set<>
              (&(this_02->field_0)._impl_.type_name_,&map_field->key_type_name,pAVar6);
  }
  else {
    FieldDescriptorProto::set_type(this_02,map_field->key_type);
  }
  this_03 = DescriptorProto::add_field((DescriptorProto *)entry_name.field_2._8_8_);
  puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_03->field_0)._impl_._has_bits_,0);
  *(byte *)puVar5 = (byte)*puVar5 | 1;
  pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_03);
  protobuf::internal::ArenaStringPtr::Set(&(this_03->field_0)._impl_.name_,"value",pAVar6);
  FieldDescriptorProto::set_label(this_03,FieldDescriptorProto_Label_LABEL_OPTIONAL);
  FieldDescriptorProto::set_number(this_03,2);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    puVar5 = protobuf::internal::HasBits<1>::operator[](&(this_03->field_0)._impl_._has_bits_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 4;
    pAVar6 = protobuf::MessageLite::GetArena((MessageLite *)this_03);
    protobuf::internal::ArenaStringPtr::Set<>
              (&(this_03->field_0)._impl_.type_name_,&map_field->value_type_name,pAVar6);
  }
  else {
    FieldDescriptorProto::set_type(this_03,map_field->value_type);
  }
  option._4_4_ = 0;
  while( true ) {
    pFVar8 = FieldDescriptorProto::options(field);
    iVar2 = FieldOptions::uninterpreted_option_size(pFVar8);
    if (iVar2 <= option._4_4_) break;
    pFVar8 = FieldDescriptorProto::options(field);
    this_04 = FieldOptions::uninterpreted_option(pFVar8,option._4_4_);
    iVar2 = UninterpretedOption::name_size(this_04);
    if (iVar2 == 1) {
      pUVar9 = UninterpretedOption::name(this_04,0);
      psVar4 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar9);
      bVar1 = std::operator==(psVar4,"enforce_utf8");
      if (bVar1) {
        pUVar9 = UninterpretedOption::name(this_04,0);
        bVar1 = UninterpretedOption_NamePart::is_extension(pUVar9);
        if (!bVar1) {
          FVar3 = FieldDescriptorProto::type(this_02);
          if (FVar3 == FieldDescriptorProto_Type_TYPE_STRING) {
            pFVar8 = FieldDescriptorProto::mutable_options(this_02);
            pUVar10 = FieldOptions::add_uninterpreted_option(pFVar8);
            UninterpretedOption::operator=(pUVar10,this_04);
          }
          FVar3 = FieldDescriptorProto::type(this_03);
          if (FVar3 == FieldDescriptorProto_Type_TYPE_STRING) {
            pFVar8 = FieldDescriptorProto::mutable_options(this_03);
            pUVar10 = FieldOptions::add_uninterpreted_option(pFVar8);
            UninterpretedOption::operator=(pUVar10,this_04);
          }
        }
      }
    }
    pUVar9 = UninterpretedOption::name(this_04,0);
    psVar4 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar9);
    bVar1 = std::operator==(psVar4,"features");
    if (bVar1) {
      pUVar9 = UninterpretedOption::name(this_04,0);
      bVar1 = UninterpretedOption_NamePart::is_extension(pUVar9);
      if (!bVar1) {
        pFVar8 = FieldDescriptorProto::mutable_options(this_02);
        pUVar10 = FieldOptions::add_uninterpreted_option(pFVar8);
        UninterpretedOption::operator=(pUVar10,this_04);
        pFVar8 = FieldDescriptorProto::mutable_options(this_03);
        pUVar10 = FieldOptions::add_uninterpreted_option(pFVar8);
        UninterpretedOption::operator=(pUVar10,this_04);
      }
    }
    option._4_4_ = option._4_4_ + 1;
  }
  std::__cxx11::string::~string((string *)local_e0);
  return;
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate all features to the generated key and value fields. This helps
  // simplify the implementation of code generators and also reflection-based
  // parsing code. Instead of having to implement complex inheritance rules
  // special-casing maps, we can just copy them at generation time.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [features.some_feature = VALUE];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [features.some_feature = VALUE];
  //       string value = 2 [features.some_feature = VALUE];
  //     }
  //     repeated ValueEntry value = 1 [features.some_feature = VALUE];
  //  }
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    // Legacy handling for the `enforce_utf8` option, which bears a striking
    // similarity to features in many respects.
    // TODO Delete this once proto2/proto3 have been turned down.
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *key_field->mutable_options()->add_uninterpreted_option() = option;
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *value_field->mutable_options()->add_uninterpreted_option() = option;
      }
    }
    if (option.name(0).name_part() == "features" &&
        !option.name(0).is_extension()) {
      *key_field->mutable_options()->add_uninterpreted_option() = option;
      *value_field->mutable_options()->add_uninterpreted_option() = option;
    }
  }
}